

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatString.hpp
# Opt level: O2

void Diligent::
     FormatStrSS<std::__cxx11::stringstream,char[17],char_const*,char[12],unsigned_int,char[43],unsigned_int,char[18],char_const*,char[58]>
               (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *ss,
               char (*FirstArg) [17],char **RestArgs,char (*RestArgs_1) [12],uint *RestArgs_2,
               char (*RestArgs_3) [43],uint *RestArgs_4,char (*RestArgs_5) [18],char **RestArgs_6,
               char (*RestArgs_7) [58])

{
  std::operator<<((ostream *)(ss + 0x10),*FirstArg);
  FormatStrSS<std::__cxx11::stringstream,char_const*,char[12],unsigned_int,char[43],unsigned_int,char[18],char_const*,char[58]>
            (ss,RestArgs,RestArgs_1,RestArgs_2,RestArgs_3,RestArgs_4,RestArgs_5,RestArgs_6,
             RestArgs_7);
  return;
}

Assistant:

void FormatStrSS(SSType& ss, const FirstArgType& FirstArg, const RestArgsType&... RestArgs)
{
    FormatStrSS(ss, FirstArg);
    FormatStrSS(ss, RestArgs...); // recursive call using pack expansion syntax
}